

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kf_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_68f54f::KeyFrameIntervalTestLarge::~KeyFrameIntervalTestLarge
          (KeyFrameIntervalTestLarge *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

~KeyFrameIntervalTestLarge() override = default;